

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr1502.cpp
# Opt level: O1

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[1]);
  dVar3 = sin(j[2]);
  dVar4 = cos(j[2]);
  dVar5 = sin(j[1]);
  dVar6 = sin(j[3]);
  dVar7 = cos(j[3]);
  dVar8 = sin(*j);
  dVar9 = sin(j[4]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar15 = dVar1 * dVar2;
  dVar16 = dVar2 * dVar3;
  dVar13 = dVar4 * dVar5;
  dVar19 = -dVar3 * dVar15 - dVar13 * dVar1;
  dVar17 = (-dVar16 - dVar13) * dVar8;
  dVar21 = dVar1 * dVar7 - dVar6 * dVar17;
  dVar22 = dVar19 * dVar6 + dVar7 * dVar8;
  dVar20 = dVar2 * dVar4;
  dVar23 = dVar3 * dVar5;
  dVar18 = (dVar20 - dVar23) * dVar1;
  *eerot = dVar18 * dVar10 + (dVar19 * dVar7 - dVar6 * dVar8) * dVar9;
  dVar18 = dVar18 * dVar9;
  dVar14 = (dVar6 * dVar8 - dVar19 * dVar7) * dVar10;
  eerot[1] = dVar12 * dVar22 + (-dVar18 - dVar14) * dVar11;
  eerot[2] = (dVar14 + dVar18) * dVar12 + dVar22 * dVar11;
  dVar3 = dVar3 * 0.055;
  dVar18 = dVar4 * 0.23;
  dVar22 = dVar23 - dVar20;
  *eetrans = dVar1 * -0.055 * dVar13 +
             (dVar19 * dVar7 * 0.23 - dVar6 * dVar8 * 0.23) * dVar9 +
             (dVar1 * -0.23 * dVar23 + dVar15 * dVar18) * dVar10 +
             (((dVar1 * 1.1 * dVar20 + dVar1 * 0.35 + dVar15 * 1.25) - dVar3 * dVar15) -
             dVar1 * 1.1 * dVar23);
  dVar19 = dVar2 * dVar8;
  dVar14 = dVar4 * dVar19 - dVar23 * dVar8;
  dVar15 = -dVar1 * dVar6 - dVar7 * dVar17;
  eerot[3] = dVar15 * dVar9 + (dVar23 * dVar8 - dVar8 * dVar20) * dVar10;
  eerot[4] = dVar12 * dVar21 + (dVar15 * dVar10 + dVar9 * dVar14) * dVar11;
  eerot[5] = dVar21 * dVar11 +
             (dVar14 * -dVar9 - (-(dVar1 * dVar6) - dVar7 * dVar17) * dVar10) * dVar12;
  eetrans[1] = dVar19 * -1.1 * dVar4 +
               (dVar1 * dVar6 * -0.23 - dVar17 * dVar7 * 0.23) * dVar9 +
               dVar19 * -1.25 +
               dVar13 * 0.055 * dVar8 +
               dVar8 * -0.35 +
               (dVar8 * 0.23 * dVar23 - dVar18 * dVar19) * dVar10 +
               dVar3 * dVar19 + dVar23 * 1.1 * dVar8;
  eerot[6] = dVar22 * dVar7 * dVar9 + (-dVar13 - dVar16) * dVar10;
  dVar1 = dVar22 * dVar7 * dVar10;
  eerot[7] = dVar12 * dVar22 * dVar6 + (dVar9 * (dVar16 + dVar13) + dVar1) * dVar11;
  eerot[8] = ((dVar16 + dVar13) * -dVar9 - dVar1) * dVar12 + dVar22 * dVar6 * dVar11;
  eetrans[2] = dVar5 * -1.25 +
               dVar13 * -1.1 +
               dVar16 * -1.1 +
               (dVar16 * -0.23 - dVar18 * dVar5) * dVar10 +
               dVar20 * -0.055 +
               (dVar23 * 0.23 - dVar2 * dVar18) * dVar7 * dVar9 + dVar3 * dVar5 + 0.75;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.23)*x3);
x13=((1.0)*x6);
x14=((1.1)*x0);
x15=((0.23)*x6);
x16=((1.0)*x7);
x17=((0.23)*x7);
x18=((0.055)*x2);
x19=((1.0)*x2);
x20=((1.0)*x0);
x21=(x0*x5);
x22=(x1*x7);
x23=(x1*x3);
x24=((-1.0)*x9);
x25=(x2*x4);
x26=(x0*x1);
x27=((-1.0)*x8);
x28=(x1*x2);
x29=(x3*x4);
x30=(x6*x8);
x31=(x16*x5);
x32=(x0*x13);
x33=(x16*x25);
x34=((((-1.0)*x23))+x25);
x35=(x28+x29);
x36=(x34*x5);
x37=(x34*x6);
x38=(x0*(((((-1.0)*x19*x4))+x23)));
x39=((((-1.0)*x33))+((x22*x3)));
x40=(x37*x9);
x41=((((-1.0)*x19*x26))+(((-1.0)*x20*x29)));
x42=(x16*(((((-1.0)*x28))+(((-1.0)*x29)))));
x43=(x38*x8);
x44=(x41*x6);
x45=(x42*x5);
x46=((-1.0)*x42);
x47=(((x41*x5))+((x6*x7)));
x48=(x31+(((-1.0)*x13*x41)));
x49=((((-1.0)*x20*x5))+(((-1.0)*x13*x42)));
x50=(x48*x9);
eerot[0]=(((x38*x9))+((x8*(((((-1.0)*x31))+x44)))));
eerot[1]=(((x11*x47))+((x10*(((((-1.0)*x43))+(((-1.0)*x50)))))));
eerot[2]=(((x11*((x43+x50))))+((x10*x47)));
eetrans[0]=((((0.35)*x0))+(((1.25)*x26))+((x14*x23))+(((-1.0)*x18*x26))+(((-1.0)*x14*x25))+((x9*(((((-0.23)*x0*x25))+((x12*x26))))))+((x8*((((x15*x41))+(((-1.0)*x17*x5))))))+(((-0.055)*x0*x29)));
eerot[3]=(((x49*x8))+((x9*(((((-1.0)*x16*x23))+x33)))));
eerot[4]=(((x11*(((((-1.0)*x45))+x32))))+((x10*((((x49*x9))+((x39*x8)))))));
eerot[5]=(((x10*(((((-1.0)*x45))+x32))))+((x11*((((x27*x39))+((x24*(((((-1.0)*x21))+((x46*x6)))))))))));
eetrans[1]=(((x18*x22))+(((1.1)*x25*x7))+((x9*(((((-1.0)*x12*x22))+((x17*x25))))))+(((-0.35)*x7))+(((0.055)*x29*x7))+(((-1.25)*x22))+((x8*(((((-1.0)*x15*x42))+(((-0.23)*x21))))))+(((-1.1)*x22*x3)));
eerot[6]=(((x30*x34))+((x9*(((((-1.0)*x29))+(((-1.0)*x1*x19)))))));
eerot[7]=(((x11*x36))+((x10*((((x35*x8))+x40)))));
eerot[8]=(((x11*((((x27*x35))+((x24*x37))))))+((x10*x36)));
IkReal x51=((1.0)*x12);
eetrans[2]=((0.75)+((x18*x4))+((x30*(((((-1.0)*x1*x51))+(((0.23)*x25))))))+(((-0.055)*x23))+((x9*(((((-1.0)*x4*x51))+(((-0.23)*x28))))))+(((-1.1)*x28))+(((-1.1)*x29))+(((-1.25)*x4)));
}